

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O3

void __thiscall
glu::Texture2DArray::loadCompressed
          (Texture2DArray *this,int numLevels,CompressedTexture *levels,
          TexDecompressionParams *decompressionParams)

{
  CompressedTexture *this_00;
  pointer pPVar1;
  pointer puVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_01;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  PixelBufferAccess refLevelAccess;
  long lVar5;
  
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  dVar4 = getGLFormat(levels->m_format);
  if (this->m_glTexture == 0) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"m_glTexture",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x26c);
LAB_00a1158a:
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar5 + 0xb8))(0x8c1a);
  if (0 < numLevels) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      tcu::Texture2DArray::allocLevel(&this->m_refTexture,(int)uVar8);
      pPVar1 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      refLevelAccess.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar1 + uVar8);
      lVar6 = 2;
      do {
        refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[lVar6 + -2] =
             *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar6 * 4 + lVar9 + -8);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 5);
      lVar6 = 5;
      do {
        refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[lVar6 + -2] =
             *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar6 * 4 + lVar9 + -8);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      refLevelAccess.super_ConstPixelBufferAccess.m_data =
           *(void **)((TextureFormat *)(pPVar1 + uVar8) + 4);
      if (((levels[uVar8].m_width != refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[0])
          || (this_00 = levels + uVar8,
             this_00->m_height != refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[1])) ||
         (this_00->m_depth != refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[2])) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,
                   "level.getWidth() == refLevelAccess.getWidth() && level.getHeight() == refLevelAccess.getHeight() && level.getDepth() == refLevelAccess.getDepth()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                   ,0x278);
        goto LAB_00a1158a;
      }
      tcu::CompressedTexture::decompress(this_00,&refLevelAccess,decompressionParams);
      puVar2 = (this_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar5 + 0x290))
                (0x8c1a,uVar8,dVar4,this_00->m_width,this_00->m_height,
                 (this->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].super_ConstPixelBufferAccess.
                 m_size.m_data[2],0,
                 *(int *)&(this_00->m_data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (int)puVar2,puVar2);
      uVar7 = (int)uVar8 + 1;
      lVar9 = lVar9 + 0x28;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != numLevels);
  }
  dVar4 = (**(code **)(lVar5 + 0x800))();
  checkError(dVar4,"Texture upload failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x280);
  return;
}

Assistant:

void Texture2DArray::loadCompressed (int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
{
	const glw::Functions&	gl					= m_context.getFunctions();
	deUint32				compressedFormat	= getGLFormat(levels[0].getFormat());

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_glTexture);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const tcu::CompressedTexture& level = levels[levelNdx];

		// Decompress to reference texture.
		m_refTexture.allocLevel(levelNdx);
		tcu::PixelBufferAccess refLevelAccess = m_refTexture.getLevel(levelNdx);
		TCU_CHECK(level.getWidth()	== refLevelAccess.getWidth() &&
				  level.getHeight()	== refLevelAccess.getHeight() &&
				  level.getDepth()	== refLevelAccess.getDepth());
		level.decompress(refLevelAccess, decompressionParams);

		// Upload to GL texture in compressed form.
		gl.compressedTexImage3D(GL_TEXTURE_2D_ARRAY, levelNdx, compressedFormat,
								level.getWidth(), level.getHeight(), m_refTexture.getLevel(levelNdx).getDepth(), 0 /* border */, level.getDataSize(), level.getData());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}